

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void ComputeHistogramCost(VP8LHistogram *h)

{
  uint64_t uVar1;
  ulong uVar2;
  int unaff_EBP;
  uint16_t *trivial_sym;
  uint32_t *unaff_R15;
  
  trivial_sym = h->trivial_symbol;
  uVar2 = 0;
  do {
    switch(uVar2 & 0xffffffff) {
    case 0:
      unaff_R15 = h->literal;
      unaff_EBP = (1 << ((byte)h->palette_code_bits & 0x1f)) + 0x118;
      if (h->palette_code_bits < 1) {
        unaff_EBP = 0x118;
      }
      break;
    case 1:
      unaff_R15 = h->red;
      unaff_EBP = 0x100;
      break;
    case 2:
      unaff_R15 = h->blue;
      unaff_EBP = 0x100;
      break;
    case 3:
      unaff_R15 = h->alpha;
      unaff_EBP = 0x100;
      break;
    case 4:
      unaff_R15 = h->distance;
      unaff_EBP = 0x28;
    }
    uVar1 = PopulationCost(unaff_R15,unaff_EBP,trivial_sym,h->is_used + uVar2);
    h->costs[uVar2] = uVar1;
    uVar2 = uVar2 + 1;
    trivial_sym = trivial_sym + 1;
  } while (uVar2 != 5);
  h->bit_cost = h->costs[3] + h->costs[1] + h->costs[2] + h->costs[0] + h->costs[4];
  return;
}

Assistant:

static void ComputeHistogramCost(VP8LHistogram* const h) {
  int i;
  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    const uint32_t* population;
    int length;
    GetPopulationInfo(h, i, &population, &length);
    h->costs[i] = PopulationCost(population, length, &h->trivial_symbol[i],
                                 &h->is_used[i]);
  }
  h->bit_cost = h->costs[LITERAL] + h->costs[RED] + h->costs[BLUE] +
                h->costs[ALPHA] + h->costs[DISTANCE];
}